

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O1

void anon_unknown.dwarf_8edeb::findEdgePoints<double>
               (vector<double,_std::allocator<double>_> *positive,
               vector<double,_std::allocator<double>_> *negative,
               vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second,EdgeParameter *edgeParameter,
               bool forwardDirection)

{
  int iVar1;
  edgeType eVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  int *piVar6;
  pointer piVar7;
  
  getDerivatives(data,first,second);
  getEdgePoints<double>(positive,data,first,second,edgeParameter);
  removeSimilarPoints<double>(positive);
  piVar3 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar7 = piVar4 + -1;
  if (piVar3 < piVar7 && piVar3 != piVar4) {
    do {
      piVar6 = piVar3 + 1;
      iVar1 = *piVar3;
      *piVar3 = *piVar7;
      *piVar7 = iVar1;
      piVar7 = piVar7 + -1;
      piVar3 = piVar6;
    } while (piVar6 < piVar7);
  }
  getDerivatives(data,first,second);
  getEdgePoints<double>(negative,data,first,second,edgeParameter);
  removeSimilarPoints<double>(negative);
  eVar2 = edgeParameter->edge;
  if ((forwardDirection && eVar2 == FIRST) || ((eVar2 == LAST & ~forwardDirection) == 1)) {
    if (8 < (ulong)((long)(positive->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(positive->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start)) {
      std::vector<double,_std::allocator<double>_>::resize(positive,1);
    }
    leaveLastElement<double>(negative);
    return;
  }
  bVar5 = eVar2 == FIRST;
  if (forwardDirection) {
    bVar5 = eVar2 == LAST;
  }
  if ((bVar5) &&
     (leaveLastElement<double>(positive),
     8 < (ulong)((long)(negative->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(negative->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start))) {
    std::vector<double,_std::allocator<double>_>::resize(negative,1);
    return;
  }
  return;
}

Assistant:

void findEdgePoints( std::vector < _Type > & positive, std::vector < _Type > & negative, std::vector < int > & data,
                         std::vector < int > & first, std::vector < int > & second, const EdgeParameter & edgeParameter, bool forwardDirection )
    {
        getDerivatives( data, first, second );
        getEdgePoints( positive, data, first, second, edgeParameter );
        removeSimilarPoints( positive );

        std::reverse( data.begin(), data.end() );
        getDerivatives( data, first, second );
        getEdgePoints( negative, data, first, second, edgeParameter );
        removeSimilarPoints( negative );
        if ( (forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::LAST) ) {
            leaveFirstElement( positive );
            leaveLastElement( negative );
        }
        else if ( (forwardDirection && edgeParameter.edge == EdgeParameter::LAST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) ) {
            leaveLastElement( positive );
            leaveFirstElement( negative );
        }
    }